

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O3

char * __thiscall
cmCommandArgumentParserHelper::ExpandVariable(cmCommandArgumentParserHelper *this,char *var)

{
  pointer pcVar1;
  cmMakefile *pcVar2;
  Snapshot snapshot;
  bool bVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  cmake *this_00;
  pointer pcVar8;
  cmListFileContext lfc;
  cmOutputConverter converter;
  ostringstream ostr;
  allocator local_26b;
  allocator local_26a;
  allocator local_269;
  string local_268;
  undefined1 local_248 [32];
  _Alloc_hider local_228;
  size_type local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  long local_208;
  string local_200;
  string local_1e0;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  PositionType local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  if (var == (char *)0x0) {
    return (char *)0x0;
  }
  if ((-1 < this->FileLine) && (iVar5 = strcmp(var,"CMAKE_CURRENT_LIST_LINE"), iVar5 == 0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::_M_insert<long>((long)local_1a8);
    std::__cxx11::stringbuf::str();
    pcVar7 = AddString(this,(string *)local_248);
    if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
      operator_delete((void *)local_248._0_8_,CONCAT71(local_248._17_7_,local_248[0x10]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    return pcVar7;
  }
  pcVar2 = this->Makefile;
  pcVar1 = local_1a8 + 0x10;
  local_1a8._0_8_ = pcVar1;
  sVar6 = strlen(var);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,var,var + sVar6);
  pcVar7 = cmMakefile::GetDefinition(pcVar2,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (pcVar7 == (char *)0x0) {
    if (this->RemoveEmpty == false) {
      if (this->WarnUninitialized == true) {
        pcVar2 = this->Makefile;
        local_1a8._0_8_ = pcVar1;
        sVar6 = strlen(var);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,var,var + sVar6);
        bVar3 = cmMakefile::VariableInitialized(pcVar2,(string *)local_1a8);
        if ((pointer)local_1a8._0_8_ != pcVar1) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        if (!bVar3) {
          if (this->CheckSystemVars == false) {
            std::__cxx11::string::string((string *)local_1a8,this->FileName,(allocator *)&local_1e0)
            ;
            pcVar7 = cmMakefile::GetHomeDirectory(this->Makefile);
            std::__cxx11::string::string((string *)local_248,pcVar7,&local_26b);
            bVar3 = cmsys::SystemTools::IsSubDirectory((string *)local_1a8,(string *)local_248);
            bVar4 = true;
            if (!bVar3) {
              std::__cxx11::string::string((string *)&local_200,this->FileName,&local_269);
              pcVar7 = cmMakefile::GetHomeOutputDirectory(this->Makefile);
              std::__cxx11::string::string((string *)&local_268,pcVar7,&local_26a);
              bVar4 = cmsys::SystemTools::IsSubDirectory(&local_200,&local_268);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_268._M_dataplus._M_p != &local_268.field_2) {
                operator_delete(local_268._M_dataplus._M_p,
                                local_268.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_200._M_dataplus._M_p != &local_200.field_2) {
                operator_delete(local_200._M_dataplus._M_p,
                                local_200.field_2._M_allocated_capacity + 1);
              }
            }
            if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
              operator_delete((void *)local_248._0_8_,CONCAT71(local_248._17_7_,local_248[0x10]) + 1
                             );
            }
            if ((pointer)local_1a8._0_8_ != pcVar1) {
              operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
            }
            if (bVar4 == false) {
              return (char *)0x0;
            }
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          local_248._8_8_ = 0;
          local_248[0x10] = '\0';
          local_220 = 0;
          local_218._M_local_buf[0] = '\0';
          local_208 = 0;
          local_248._0_8_ = local_248 + 0x10;
          local_228._M_p = (pointer)&local_218;
          cmMakefile::GetStateSnapshot(this->Makefile);
          snapshot.Position.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)uStack_1b8;
          snapshot.State = (cmState *)local_1c0;
          snapshot.Position.Position = local_1b0;
          cmOutputConverter::cmOutputConverter((cmOutputConverter *)&local_200,snapshot);
          std::__cxx11::string::string((string *)&local_1e0,this->FileName,&local_26b);
          cmOutputConverter::Convert
                    (&local_268,(cmOutputConverter *)&local_200,&local_1e0,HOME,UNCHANGED);
          std::__cxx11::string::operator=((string *)&local_228,(string *)&local_268);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
            operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
          }
          local_208 = this->FileLine;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"uninitialized variable \'",0x18);
          sVar6 = strlen(var);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,var,sVar6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\'",1);
          this_00 = cmMakefile::GetCMakeInstance(this->Makefile);
          std::__cxx11::stringbuf::str();
          cmake::IssueMessage(this_00,AUTHOR_WARNING,&local_268,(cmListFileContext *)local_248);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_p != &local_218) {
            operator_delete(local_228._M_p,
                            CONCAT71(local_218._M_allocated_capacity._1_7_,local_218._M_local_buf[0]
                                    ) + 1);
          }
          if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
            operator_delete((void *)local_248._0_8_,CONCAT71(local_248._17_7_,local_248[0x10]) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
        }
      }
      return (char *)0x0;
    }
    pcVar7 = "";
  }
  else if (this->EscapeQuotes == true) {
    local_248._0_8_ = local_248 + 0x10;
    sVar6 = strlen(pcVar7);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_248,pcVar7,pcVar7 + sVar6);
    cmSystemTools::EscapeQuotes((string *)local_1a8,(string *)local_248);
    pcVar7 = AddString(this,(string *)local_1a8);
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if ((undefined1 *)local_248._0_8_ == local_248 + 0x10) {
      return pcVar7;
    }
    local_1a8._16_8_ = CONCAT71(local_248._17_7_,local_248[0x10]);
    pcVar8 = (pointer)local_248._0_8_;
    goto LAB_00417e98;
  }
  local_1a8._0_8_ = pcVar1;
  sVar6 = strlen(pcVar7);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,pcVar7,pcVar7 + sVar6);
  pcVar7 = AddString(this,(string *)local_1a8);
  pcVar8 = (pointer)local_1a8._0_8_;
  if ((pointer)local_1a8._0_8_ == pcVar1) {
    return pcVar7;
  }
LAB_00417e98:
  operator_delete(pcVar8,local_1a8._16_8_ + 1);
  return pcVar7;
}

Assistant:

char* cmCommandArgumentParserHelper::ExpandVariable(const char* var)
{
  if(!var)
    {
    return 0;
    }
  if(this->FileLine >= 0 && strcmp(var, "CMAKE_CURRENT_LIST_LINE") == 0)
    {
    std::ostringstream ostr;
    ostr << this->FileLine;
    return this->AddString(ostr.str());
    }
  const char* value = this->Makefile->GetDefinition(var);
  if(!value && !this->RemoveEmpty)
    {
    // check to see if we need to print a warning
    // if strict mode is on and the variable has
    // not been "cleared"/initialized with a set(foo ) call
    if(this->WarnUninitialized && !this->Makefile->VariableInitialized(var))
      {
      if (this->CheckSystemVars ||
          cmSystemTools::IsSubDirectory(this->FileName,
                                        this->Makefile->GetHomeDirectory()) ||
          cmSystemTools::IsSubDirectory(this->FileName,
                                     this->Makefile->GetHomeOutputDirectory()))
        {
        std::ostringstream msg;
        cmListFileContext lfc;
        cmOutputConverter converter(this->Makefile->GetStateSnapshot());
        lfc.FilePath = converter.Convert(this->FileName,
                                         cmOutputConverter::HOME);

        lfc.Line = this->FileLine;
        msg << "uninitialized variable \'" << var << "\'";
        this->Makefile->GetCMakeInstance()->IssueMessage(cmake::AUTHOR_WARNING,
                                                        msg.str(), lfc);
        }
      }
    return 0;
    }
  if (this->EscapeQuotes && value)
    {
    return this->AddString(cmSystemTools::EscapeQuotes(value));
    }
  return this->AddString(value ? value : "");
}